

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::
AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::_::PromiseAndFulfillerAdapter<kj::Rc<kj::Refcounted>_>_>
::fulfill(AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::_::PromiseAndFulfillerAdapter<kj::Rc<kj::Refcounted>_>_>
          *this,Rc<kj::Refcounted> *value)

{
  undefined8 uVar1;
  ExceptionOr<kj::Rc<kj::Refcounted>_> local_1b8;
  
  if (this->waiting == true) {
    this->waiting = false;
    local_1b8.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_1b8.value.ptr.isSet = true;
    local_1b8.value.ptr.field_1.value.own.disposer = (value->own).disposer;
    local_1b8.value.ptr.field_1.value.own.ptr = (value->own).ptr;
    (value->own).ptr = (Refcounted *)0x0;
    ExceptionOr<kj::Rc<kj::Refcounted>_>::operator=(&this->result,&local_1b8);
    uVar1 = local_1b8.value.ptr.field_1.value.own.ptr;
    if ((local_1b8.value.ptr.isSet == true) &&
       (local_1b8.value.ptr.field_1.value.own.ptr != (Refcounted *)0x0)) {
      local_1b8.value.ptr.field_1.value.own.ptr = (Refcounted *)0x0;
      (**(local_1b8.value.ptr.field_1.value.own.disposer)->_vptr_Disposer)
                (local_1b8.value.ptr.field_1.value.own.disposer,
                 (_func_int *)
                 ((long)&(((Refcounted *)uVar1)->super_Disposer)._vptr_Disposer +
                 (long)(((Refcounted *)uVar1)->super_Disposer)._vptr_Disposer[-2]));
    }
    if (local_1b8.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_1b8.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }